

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void cxxopts::throw_or_mimic<cxxopts::option_syntax_exception>(string *text)

{
  option_syntax_exception *this;
  
  this = (option_syntax_exception *)__cxa_allocate_exception(0x28);
  option_syntax_exception::option_syntax_exception(this,text);
  __cxa_throw(this,&option_syntax_exception::typeinfo,OptionException::~OptionException);
}

Assistant:

void throw_or_mimic(const std::string& text)
  {
    static_assert(std::is_base_of<std::exception, T>::value,
                  "throw_or_mimic only works on std::exception and "
                  "deriving classes");

#ifndef CXXOPTS_NO_EXCEPTIONS
    // If CXXOPTS_NO_EXCEPTIONS is not defined, just throw
    throw T{text};
#else
    // Otherwise manually instantiate the exception, print what() to stderr,
    // and abort
    T exception{text};
    std::cerr << exception.what() << std::endl;
    std::cerr << "Aborting (exceptions disabled)..." << std::endl;
    std::abort();
#endif
  }